

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINGetWorkSpace(void *kinmem,long *lenrw,long *leniw)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0x38a,"KINGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *lenrw = *(long *)((long)kinmem + 0x210);
    *leniw = *(long *)((long)kinmem + 0x218);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetWorkSpace(void* kinmem, long int* lenrw, long int* leniw)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  *lenrw = kin_mem->kin_lrw;
  *leniw = kin_mem->kin_liw;

  return (KIN_SUCCESS);
}